

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O3

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error,string *cmp0115Warning)

{
  cmMakefile *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  PolicyStatus PVar6;
  PolicyStatus PVar7;
  cmake *this_01;
  string *psVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  pointer pbVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string err;
  anon_class_56_7_c6d6a0c4 findInDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exts;
  string local_118;
  string local_f8;
  size_type local_d8;
  pointer local_d0;
  cmMakefile *local_c8;
  string local_c0;
  undefined1 local_a0 [32];
  string *local_80;
  bool local_78;
  cmMakefile *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((this->IsGenerated != false) ||
     (bVar5 = GetPropertyAsBool(this,&propGENERATED_abi_cxx11_), bVar5)) {
    cmSourceFileLocation::DirectoryUseBinary(&this->Location);
    cmSourceFileLocation::GetFullPath_abi_cxx11_((string *)local_a0,&this->Location);
    std::__cxx11::string::operator=((string *)&this->FullPath,(string *)local_a0);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    this->FindFullPathFailed = false;
    return true;
  }
  if (this->FindFullPathFailed != false) {
    return false;
  }
  this_00 = (this->Location).Makefile;
  cmSourceFileLocation::GetFullPath_abi_cxx11_(&local_68,&this->Location);
  this_01 = cmMakefile::GetCMakeInstance(this_00);
  cmake::GetAllExtensions_abi_cxx11_(&local_48,this_01);
  PVar6 = cmMakefile::GetPolicyStatus(this_00,CMP0115,false);
  PVar7 = cmMakefile::GetPolicyStatus(this_00,CMP0118,false);
  local_78 = WARN < PVar7;
  local_a0._0_8_ = this;
  local_a0._8_8_ = &local_48;
  local_a0._16_8_ = &local_68;
  local_a0._24_4_ = PVar6;
  local_80 = cmp0115Warning;
  local_70 = this_00;
  if ((this->Location).AmbiguousDirectory == true) {
    psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    bVar5 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()
                      ((anon_class_56_7_c6d6a0c4 *)local_a0,psVar8);
    bVar9 = true;
    uVar1 = local_f8.field_2._M_allocated_capacity;
    uVar2 = local_f8.field_2._8_8_;
    if (bVar5) goto LAB_002ce945;
    psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    bVar5 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()
                      ((anon_class_56_7_c6d6a0c4 *)local_a0,psVar8);
    uVar1 = local_f8.field_2._M_allocated_capacity;
    uVar2 = local_f8.field_2._8_8_;
    _Var3._M_p = local_68._M_dataplus._M_p;
    sVar4 = local_68._M_string_length;
  }
  else {
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity =
         local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    bVar5 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()
                      ((anon_class_56_7_c6d6a0c4 *)local_a0,&local_f8);
    uVar1 = local_f8.field_2._M_allocated_capacity;
    uVar2 = local_f8.field_2._8_8_;
    _Var3._M_p = local_68._M_dataplus._M_p;
    sVar4 = local_68._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      uVar1 = local_f8.field_2._M_allocated_capacity;
      uVar2 = local_f8.field_2._8_8_;
      _Var3._M_p = local_68._M_dataplus._M_p;
      sVar4 = local_68._M_string_length;
    }
  }
  local_f8.field_2._M_allocated_capacity = sVar4;
  local_f8.field_2._8_8_ = _Var3._M_p;
  bVar9 = true;
  local_68._M_dataplus._M_p = (pointer)local_f8.field_2._8_8_;
  if (!bVar5) {
    local_f8._M_dataplus._M_p = (pointer)0x1b;
    local_f8._M_string_length = 0x75fa54;
    views._M_len = 2;
    views._M_array = (iterator)&local_f8;
    local_c8 = this_00;
    cmCatViews_abi_cxx11_(&local_118,views);
    if (PVar6 < NEW) {
      local_f8._M_dataplus._M_p = (pointer)local_118._M_string_length;
      local_f8._M_string_length = (size_type)local_118._M_dataplus._M_p;
      local_f8.field_2._M_allocated_capacity = 0x11;
      local_f8.field_2._8_8_ = (long)"\n\nTried extensions" + 1;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_f8;
      cmCatViews_abi_cxx11_(&local_c0,views_00);
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar10 = local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_f8._M_dataplus._M_p = (pointer)local_118._M_string_length;
          local_f8._M_string_length = (size_type)local_118._M_dataplus._M_p;
          local_f8.field_2._M_allocated_capacity = 2;
          local_f8.field_2._8_8_ = (long)" --build ." + 8;
          local_d0 = (pbVar10->_M_dataplus)._M_p;
          local_d8 = pbVar10->_M_string_length;
          views_01._M_len = 3;
          views_01._M_array = (iterator)&local_f8;
          cmCatViews_abi_cxx11_(&local_c0,views_01);
          std::__cxx11::string::operator=((string *)&local_118,(string *)&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 !=
                 local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    if (error == (string *)0x0) {
      cmMakefile::IssueMessage(local_c8,FATAL_ERROR,&local_118);
    }
    else {
      std::__cxx11::string::operator=((string *)error,(string *)&local_118);
    }
    this->FindFullPathFailed = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    bVar9 = false;
    uVar1 = local_f8.field_2._M_allocated_capacity;
    uVar2 = local_f8.field_2._8_8_;
  }
LAB_002ce945:
  local_f8.field_2._8_8_ = uVar2;
  local_f8.field_2._M_allocated_capacity = uVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return bVar9;
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error,
                                std::string* cmp0115Warning)
{
  // If the file is generated compute the location without checking on disk.
  // Note: We also check for a locally set GENERATED property, because
  //       it might have been set before policy CMP0118 was set to NEW.
  if (this->GetIsGenerated(CheckScope::GlobalAndLocal)) {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetFullPath();
    this->FindFullPathFailed = false;
    return true;
  }

  // If this method has already failed once do not try again.
  if (this->FindFullPathFailed) {
    return false;
  }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* makefile = this->Location.GetMakefile();
  // Location path
  std::string const& lPath = this->Location.GetFullPath();
  // List of extension lists
  std::vector<std::string> exts =
    makefile->GetCMakeInstance()->GetAllExtensions();
  auto cmp0115 = makefile->GetPolicyStatus(cmPolicies::CMP0115);
  auto cmp0118 = makefile->GetPolicyStatus(cmPolicies::CMP0118);
  bool const cmp0118new =
    cmp0118 != cmPolicies::OLD && cmp0118 != cmPolicies::WARN;

  // Tries to find the file in a given directory
  auto findInDir = [this, &exts, &lPath, cmp0115, cmp0115Warning, cmp0118new,
                    makefile](std::string const& dir) -> bool {
    // Compute full path
    std::string const fullPath = cmSystemTools::CollapseFullPath(lPath, dir);
    // Try full path
    if (cmp0118new &&
        makefile->GetGlobalGenerator()->IsGeneratedFile(fullPath)) {
      this->IsGenerated = true;
    }
    if (this->IsGenerated || cmSystemTools::FileExists(fullPath)) {
      this->FullPath = fullPath;
      return true;
    }
    // This has to be an if statement due to a bug in Oracle Developer Studio.
    // See https://community.oracle.com/tech/developers/discussion/4476246/
    // for details.
    if (cmp0115 == cmPolicies::OLD || cmp0115 == cmPolicies::WARN) {
      // Try full path with extension
      for (std::string const& ext : exts) {
        if (!ext.empty()) {
          std::string extPath = cmStrCat(fullPath, '.', ext);
          if (cmp0118new &&
              makefile->GetGlobalGenerator()->IsGeneratedFile(extPath)) {
            this->IsGenerated = true;
          }
          if (this->IsGenerated || cmSystemTools::FileExists(extPath)) {
            this->FullPath = extPath;
            if (cmp0115 == cmPolicies::WARN) {
              std::string warning =
                cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0115),
                         "\nFile:\n  ", extPath);
              if (cmp0115Warning) {
                *cmp0115Warning = std::move(warning);
              } else {
                makefile->GetCMakeInstance()->IssueMessage(
                  MessageType::AUTHOR_WARNING, warning);
              }
            }
            return true;
          }
        }
      }
    }
    // File not found
    return false;
  };

  // Try to find the file in various directories
  if (this->Location.DirectoryIsAmbiguous()) {
    if (findInDir(makefile->GetCurrentSourceDirectory()) ||
        findInDir(makefile->GetCurrentBinaryDirectory())) {
      return true;
    }
  } else {
    if (findInDir({})) {
      return true;
    }
  }

  // Compose error
  std::string err = cmStrCat("Cannot find source file:\n  ", lPath);
  switch (cmp0115) {
    case cmPolicies::OLD:
    case cmPolicies::WARN:
      err = cmStrCat(err, "\nTried extensions");
      for (auto const& ext : exts) {
        err = cmStrCat(err, " .", ext);
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      break;
  }
  if (error != nullptr) {
    *error = std::move(err);
  } else {
    makefile->IssueMessage(MessageType::FATAL_ERROR, err);
  }
  this->FindFullPathFailed = true;

  // File not found
  return false;
}